

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void lex_ident(Lexer *lxr)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  uint64_t uVar5;
  int local_1c;
  int i;
  char *ident;
  Lexer *lxr_local;
  
  pcVar2 = lxr->code;
  iVar1 = lxr->cursor;
  while (iVar3 = is_ident_continue(lxr->code[lxr->cursor]), iVar3 != 0) {
    lxr->cursor = lxr->cursor + 1;
  }
  (lxr->tk).length = lxr->cursor - (lxr->tk).start;
  local_1c = 0;
  while( true ) {
    if (lex_ident::keywords[local_1c] == (char *)0x0) {
      (lxr->tk).type = 0x114;
      uVar5 = hash_string(pcVar2 + iVar1,(long)(lxr->tk).length);
      (lxr->tk).field_4.ident_hash = uVar5;
      return;
    }
    iVar3 = (lxr->tk).length;
    sVar4 = strlen(lex_ident::keywords[local_1c]);
    if (((long)iVar3 == sVar4) &&
       (iVar3 = strncmp(pcVar2 + iVar1,lex_ident::keywords[local_1c],(long)(lxr->tk).length),
       iVar3 == 0)) break;
    local_1c = local_1c + 1;
  }
  (lxr->tk).type = lex_ident::keyword_tks[local_1c];
  return;
}

Assistant:

static void lex_ident(Lexer *lxr) {
	// Find the end of the identifier
	char *ident = &lxr->code[lxr->cursor];
	while (is_ident_continue(lxr->code[lxr->cursor])) {
		lxr->cursor++;
	}
	lxr->tk.length = lxr->cursor - lxr->tk.start;

	// A list of reserved keywords and their corresponding token values
	static char *keywords[] = {
		"let", "if", "else", "elseif", "loop", "while", "for", "fn", "true",
		"false", "nil", NULL,
	};
	static Tk keyword_tks[] = {
		TK_LET, TK_IF, TK_ELSE, TK_ELSEIF, TK_LOOP, TK_WHILE, TK_FOR, TK_FN,
		TK_TRUE, TK_FALSE, TK_NIL,
	};

	// Compare the identifier against reserved language keywords
	for (int i = 0; keywords[i] != NULL; i++) {
		if (lxr->tk.length == strlen(keywords[i]) &&
				strncmp(ident, keywords[i], lxr->tk.length) == 0) {
			// Found a matching keyword
			lxr->tk.type = keyword_tks[i];
			return;
		}
	}

	// Didn't find a matching keyword, so we have an identifier
	lxr->tk.type = TK_IDENT;
	lxr->tk.ident_hash = hash_string(ident, lxr->tk.length);
}